

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmAddLinkDirectoryForTarget(void *arg,char *tgt,char *d)

{
  cmMakefile *__s;
  cmTarget *this;
  undefined1 local_a0 [24];
  string local_88;
  allocator<char> local_51;
  string local_50;
  cmTarget *local_30;
  cmTarget *t;
  cmMakefile *mf;
  char *d_local;
  char *tgt_local;
  void *arg_local;
  
  t = (cmTarget *)arg;
  mf = (cmMakefile *)d;
  d_local = tgt;
  tgt_local = (char *)arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,tgt,&local_51);
  this = cmMakefile::FindLocalNonAliasTarget((cmMakefile *)arg,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  __s = mf;
  local_30 = this;
  if (this == (cmTarget *)0x0) {
    cmSystemTools::Error
              ("Attempt to add link directories to non-existent target: ",d_local," for directory ",
               (char *)mf);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,(char *)__s,(allocator<char> *)(local_a0 + 0x17));
    cmMakefile::GetBacktrace((cmMakefile *)local_a0);
    cmTarget::InsertLinkDirectory(this,&local_88,(cmListFileBacktrace *)local_a0,false);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_a0);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)(local_a0 + 0x17));
  }
  return;
}

Assistant:

void CCONV cmAddLinkDirectoryForTarget(void* arg, const char* tgt,
                                       const char* d)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmTarget* t = mf->FindLocalNonAliasTarget(tgt);
  if (!t) {
    cmSystemTools::Error(
      "Attempt to add link directories to non-existent target: ", tgt,
      " for directory ", d);
    return;
  }
  t->InsertLinkDirectory(d, mf->GetBacktrace());
}